

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

optional<long> __thiscall
anon_unknown.dwarf_3e90a3a::PKHDescriptor::MaxSatisfactionWeight
          (PKHDescriptor *this,bool use_max_sig)

{
  long lVar1;
  long in_FS_OFFSET;
  optional<long> oVar2;
  optional<long> oVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  oVar2 = MaxSatSize(this,use_max_sig);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value =
         oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload << 2;
    oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._9_7_
         = oVar2.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._9_7_;
    oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_engaged = true;
    return (optional<long>)
           oVar3.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<int64_t> MaxSatisfactionWeight(bool use_max_sig) const override {
        return *MaxSatSize(use_max_sig) * WITNESS_SCALE_FACTOR;
    }